

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O1

void server::owords_cmd(int cid,char **args,int argc)

{
  char *__dest;
  int cn;
  size_t sVar1;
  long lVar2;
  char colors [10];
  char owordList [1024];
  char local_442 [8];
  char acStack_43a [6];
  undefined1 auStack_434 [1028];
  
  __dest = acStack_43a + 2;
  memcpy(__dest,"Offensive words (words not to say): ",0x400);
  lVar2 = 0;
  do {
    if (owords[0][lVar2] != '\0') {
      sprintf(local_442,"\f%d",3);
      strcat(__dest,local_442);
      strcat(__dest,owords[0] + lVar2);
      sVar1 = strlen(__dest);
      builtin_strncpy(acStack_43a + sVar1 + 2,"\f2, ",4);
      auStack_434[sVar1] = 0;
    }
    lVar2 = lVar2 + 0x104;
  } while (lVar2 != 13000);
  sVar1 = strlen(__dest);
  __dest[sVar1 - 2] = '\0';
  cn = QServ::getSender(&qs);
  sendf(cn,1,"ris",0x23,__dest);
  return;
}

Assistant:

QSERV_CALLBACK owords_cmd(p) {
        char owordList[1024] = "Offensive words (words not to say): ";
        char colors[10];

        for(int i = 0; i < 50; i++) {
            if(strlen(owords[i]) > 0) {
                sprintf(colors, "\f%d", 3);
                strcat(owordList, colors);
                strcat(owordList, owords[i]);
                strcat(owordList, "\f2, ");
            }
        }
        owordList[strlen(owordList)-2] = '\0';
        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, owordList);
    }